

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_mesh.cpp
# Opt level: O3

bool dxil_spv::emit_dispatch_mesh_instruction(Impl *impl,CallInst *instruction)

{
  Id arg;
  Operation *this;
  Value *value;
  uint i;
  uint index;
  
  this = Converter::Impl::allocate(impl,OpEmitMeshTasksEXT);
  index = 1;
  do {
    value = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,index);
    arg = Converter::Impl::get_id_for_value(impl,value,0);
    Operation::add_id(this,arg);
    index = index + 1;
  } while (index != 5);
  Converter::Impl::add(impl,this,false);
  return true;
}

Assistant:

bool emit_dispatch_mesh_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	Operation *op = impl.allocate(spv::OpEmitMeshTasksEXT);

	for (unsigned i = 1; i <= 4; i++)
		op->add_id(impl.get_id_for_value(instruction->getOperand(i)));

	impl.add(op);
	return true;
}